

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O3

int Fl::screen_num(int x,int y,int w,int h)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  
  iVar7 = w + x;
  iVar6 = h + y;
  uVar12 = 0;
  fVar14 = 0.0;
  uVar2 = num_screens;
  uVar11 = 0;
  while( true ) {
    if ((int)uVar2 < 0) {
      screen_init();
      uVar2 = num_screens;
    }
    if ((int)(uVar2 + (uVar2 == 0)) <= (int)uVar12) break;
    if ((int)uVar2 < 0) {
      screen_init();
      uVar2 = num_screens;
    }
    if ((int)uVar2 < 1) {
      iVar9 = 0;
      iVar5 = 0;
      iVar8 = 0;
      iVar3 = 0;
    }
    else {
      uVar4 = 0;
      if (uVar12 < uVar2) {
        uVar4 = (ulong)uVar12;
      }
      iVar9 = (int)screens[uVar4].x_org;
      iVar5 = (int)screens[uVar4].y_org;
      iVar8 = (int)screens[uVar4].width;
      iVar3 = (int)screens[uVar4].height;
    }
    fVar13 = 0.0;
    if ((((iVar9 <= iVar7) && (iVar8 = iVar8 + iVar9, x <= iVar8)) && (iVar5 <= iVar6)) &&
       (iVar3 = iVar3 + iVar5, y <= iVar3)) {
      iVar10 = x;
      if (x <= iVar9) {
        iVar10 = iVar9;
      }
      iVar9 = iVar7;
      if (iVar8 <= iVar7) {
        iVar9 = iVar8;
      }
      iVar8 = y;
      if (y <= iVar5) {
        iVar8 = iVar5;
      }
      iVar5 = iVar6;
      if (iVar3 <= iVar6) {
        iVar5 = iVar3;
      }
      fVar13 = (float)(iVar5 - iVar8) * (float)(iVar9 - iVar10);
    }
    uVar1 = uVar12;
    if (fVar13 <= fVar14) {
      fVar13 = fVar14;
      uVar1 = uVar11;
    }
    uVar12 = uVar12 + 1;
    fVar14 = fVar13;
    uVar11 = uVar1;
  }
  return uVar11;
}

Assistant:

int Fl::screen_num(int x, int y, int w, int h) {
  int best_screen = 0;
  float best_intersection = 0.;
  for (int i = 0; i < Fl::screen_count(); i++) {
    int sx = 0, sy = 0, sw = 0, sh = 0;
    Fl::screen_xywh(sx, sy, sw, sh, i);
    float sintersection = fl_intersection(x, y, w, h, sx, sy, sw, sh);
    if (sintersection > best_intersection) {
      best_screen = i;
      best_intersection = sintersection;
    }
  }
  return best_screen;
}